

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_data.cpp
# Opt level: O3

int LS_SetGlobalFogParameter
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  int *piVar1;
  
  if (arg0 == 2) {
    piVar1 = &skyfog;
  }
  else {
    arg1 = arg1 >> 1;
    if (arg0 == 1) {
      piVar1 = &outsidefogdensity;
    }
    else {
      if (arg0 != 0) {
        return 0;
      }
      piVar1 = &fogdensity;
    }
  }
  *piVar1 = arg1;
  return 1;
}

Assistant:

int LS_SetGlobalFogParameter (line_t *ln, AActor *it, bool backSide,
	int arg0, int arg1, int arg2, int arg3, int arg4)
{
// SetGlobalFogParameter (type, value)
	switch(arg0)
	{
	case 0:
		fogdensity = arg1>>1;
		return true;

	case 1:
		outsidefogdensity = arg1>>1;
		return true;

	case 2:
		skyfog = arg1;
		return true;

	default:
		return false;
	}
}